

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poc-http.c
# Opt level: O0

int poc_mainloop(http_server_t *server,char *filename,int quiet)

{
  unsigned_long uVar1;
  __time_t _Var2;
  int iVar3;
  uint uVar4;
  long lVar5;
  int iVar6;
  float local_5f4c;
  float local_5f00;
  unsigned_long len;
  int ret;
  int i;
  unsigned_long start_usec;
  unsigned_long start_sec;
  timeval tv;
  mp3_frame_t frame;
  unsigned_long frame_time;
  file_t mp3_file;
  int quiet_local;
  char *filename_local;
  http_server_t *server_local;
  
  mp3_file.pos._4_4_ = quiet;
  iVar3 = file_open_read((file_t *)&frame_time,filename);
  if (iVar3 == 0) {
    fprintf(_stderr,"Could not open mp3 file: %s\n",filename);
    server_local._4_4_ = 0;
  }
  else {
    if (mp3_file.pos._4_4_ == 0) {
      fprintf(_stderr,"\rStreaming %s...\n",filename);
    }
    frame.raw[0xf98] = '\0';
    frame.raw[0xf99] = '\0';
    frame.raw[0xf9a] = '\0';
    frame.raw[0xf9b] = '\0';
    frame.raw[0xf9c] = '\0';
    frame.raw[0xf9d] = '\0';
    frame.raw[0xf9e] = '\0';
    frame.raw[3999] = '\0';
    while (iVar3 = mp3_next_frame((file_t *)&frame_time,(mp3_frame_t *)&tv.tv_usec),
          -1 < iVar3 && finished == 0) {
      gettimeofday((timeval *)&start_sec,(__timezone_ptr_t)0x0);
      _Var2 = tv.tv_sec;
      uVar1 = start_sec;
      iVar3 = http_server_main(server,(void *)0x0);
      if (iVar3 == 0) {
        fprintf(_stderr,"Http main error\n");
        return 0;
      }
      for (len._4_4_ = 0; len._4_4_ < server->num_clients; len._4_4_ = len._4_4_ + 1) {
        if (((server->clients[(int)len._4_4_].fd != -1) &&
            (1 < server->clients[(int)len._4_4_].found)) &&
           (uVar4 = unix_write(server->clients[(int)len._4_4_].fd,(uchar *)&frame.usec,
                               frame.samplelen), (long)(int)uVar4 != frame.samplelen)) {
          fprintf(_stderr,"Error writing to client %d: %d\n",(ulong)len._4_4_,(ulong)uVar4);
          http_client_close(server,server->clients + (int)len._4_4_);
        }
      }
      frame.raw._3992_8_ = frame.frame_data_size + frame.raw._3992_8_;
      poc_mainloop::wait_time = frame.frame_data_size + poc_mainloop::wait_time;
      if (1000 < poc_mainloop::wait_time) {
        usleep((__useconds_t)poc_mainloop::wait_time);
      }
      if (mp3_file.pos._4_4_ == 0) {
        iVar3 = poc_mainloop::count + 1;
        iVar6 = poc_mainloop::count % 10;
        poc_mainloop::count = iVar3;
        if (iVar6 == 0) {
          if (mp3_file.offset == 0) {
            fprintf(_stderr,"\r%02ld:%02ld %ld %3ldkbit/s %4ldb ",
                    (ulong)frame.raw._3992_8_ / 60000000,
                    ((ulong)frame.raw._3992_8_ / 1000000) % 0x3c,mp3_file._0_8_,frame._20104_8_,
                    frame.samplelen);
          }
          else {
            local_5f00 = (float)(ulong)mp3_file._0_8_;
            local_5f4c = (float)mp3_file.offset;
            lVar5 = (long)(((float)((ulong)frame.raw._3992_8_ / 1000) / (local_5f00 + 1.0)) *
                          local_5f4c);
            fprintf(_stderr,"\r%02ld:%02ld/%02ld:%02ld %7ld/%7ld (%3ld%%) %3ldkbit/s %4ldb ",
                    ((ulong)frame.raw._3992_8_ / 1000000) / 0x3c,
                    ((ulong)frame.raw._3992_8_ / 1000000) % 0x3c,lVar5 / 60000,(lVar5 / 1000) % 0x3c
                    ,mp3_file._0_8_,mp3_file.offset,(long)((local_5f00 * 100.0) / local_5f4c),
                    frame._20104_8_,frame.samplelen);
          }
        }
        fflush(_stderr);
      }
      gettimeofday((timeval *)&start_sec,(__timezone_ptr_t)0x0);
      poc_mainloop::wait_time =
           poc_mainloop::wait_time - ((start_sec - uVar1) * 1000000 + (tv.tv_sec - _Var2));
      iVar3 = (int)poc_mainloop::wait_time;
      if (iVar3 < 1) {
        iVar3 = -iVar3;
      }
      if (1000000 < iVar3) {
        poc_mainloop::wait_time = 0;
      }
    }
    iVar3 = file_close((file_t *)&frame_time);
    if (iVar3 == 0) {
      fprintf(_stderr,"Could not close mp3 file %s\n",filename);
      server_local._4_4_ = 0;
    }
    else {
      server_local._4_4_ = 1;
    }
  }
  return server_local._4_4_;
}

Assistant:

int poc_mainloop(http_server_t *server, char *filename, int quiet) {
  /*M
    Open file for reading.
  **/
  file_t     mp3_file;
  if (!file_open_read(&mp3_file, filename)) {
    fprintf(stderr, "Could not open mp3 file: %s\n", filename);
    return 0;
  }

  if (!quiet)
    fprintf(stderr, "\rStreaming %s...\n", filename);
  
  static long wait_time = 0;
  unsigned long frame_time = 0;
  
  mp3_frame_t    frame;

  /*M
    Cycle through the frames and send them using HTTP.
  **/
  while ((mp3_next_frame(&mp3_file, &frame) >= 0) && !finished) {
    /*M
      Get start time for this frame iteration.
    **/
    struct timeval tv;
    gettimeofday(&tv, NULL);
    unsigned long start_sec, start_usec;
    start_sec = tv.tv_sec;
    start_usec = tv.tv_usec;
    
    /*M
      Go through HTTP main routine and check for timeouts,
      received data, etc...
    **/
    if (!http_server_main(server, NULL)) {
      fprintf(stderr, "Http main error\n");
      return 0;
    }
    
    /*M
      Write frame to HTTP clients.
    **/
    int i;
    for (i = 0; i < server->num_clients; i++) {
      if ((server->clients[i].fd != -1) &&
          (server->clients[i].found >= 2)) {
        int ret;
        
        ret = unix_write(server->clients[i].fd, frame.raw, frame.frame_size);
        
        if (ret != frame.frame_size) {
          fprintf(stderr, "Error writing to client %d: %d\n", i, ret);
          http_client_close(server, server->clients + i);
        }
      }
    }
    frame_time += frame.usec;
    wait_time += frame.usec;
    
    /*M
      Sleep for duration of frame.
    **/
    if (wait_time > 1000)
      usleep(wait_time);
    
    /*M
      Print information.
    **/
    if (!quiet) {
      static int count = 0;
      if ((count++) % 10 == 0) {
        if (mp3_file.size > 0) {
          fprintf(stderr, "\r%02ld:%02ld/%02ld:%02ld %7ld/%7ld (%3ld%%) %3ldkbit/s %4ldb ",
                  (frame_time/1000000) / 60,
                  (frame_time/1000000) % 60,

                  (long)((float)(frame_time/1000) / 
                         ((float)mp3_file.offset+1) * (float)mp3_file.size) / 
                  60000,
                  (long)((float)(frame_time/1000) / 
                         ((float)mp3_file.offset+1) * (float)mp3_file.size) / 
                  1000 % 60,
                  mp3_file.offset,
                  mp3_file.size,
                  (long)(100*(float)mp3_file.offset/(float)mp3_file.size),
                  frame.bitrate,
                  frame.frame_size);
        } else {
          fprintf(stderr, "\r%02ld:%02ld %ld %3ldkbit/s %4ldb ",
                  (frame_time/1000000) / 60,
                  (frame_time/1000000) % 60,
                  mp3_file.offset,
                  frame.bitrate,
                  frame.frame_size);
        }
      }
      fflush(stderr);
    }

    /*M
      Get length of iteration.
    **/
    gettimeofday(&tv, NULL);
    unsigned long len =
      (tv.tv_sec - start_sec) * 1000000 + (tv.tv_usec - start_usec);

    wait_time -= len;
    if (abs((int)wait_time) > MAX_WAIT_TIME)
      wait_time = 0;
  }
  
  if (!file_close(&mp3_file)) {
    fprintf(stderr, "Could not close mp3 file %s\n", filename);
    return 0;
  }

  return 1;
}